

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

int __thiscall
Hpipe::Lexer::push_tok(Lexer *this,Source *source,char *beg,char *end,Type type,int grp,char delim)

{
  Lexem *pLVar1;
  bool bVar2;
  reference ppLVar3;
  Lexem *pLVar4;
  byte local_113;
  byte local_112;
  allocator local_f1;
  string local_f0;
  Lexem *local_d0;
  Lexem *p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  Lexem *local_a0;
  Lexem *item;
  string local_90;
  byte local_6d;
  byte local_5a;
  allocator local_59;
  string local_58;
  int local_38;
  Type local_34;
  int grp_local;
  Type type_local;
  char *end_local;
  char *beg_local;
  Source *source_local;
  Lexer *this_local;
  
  local_38 = grp;
  local_34 = type;
  _grp_local = end;
  end_local = beg;
  beg_local = (char *)source;
  source_local = (Source *)this;
  if ((delim != ')') && (delim != ']')) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              ((string *)&local_c0,beg,end,(allocator<char> *)((long)&p + 7));
    pLVar4 = Pool<Hpipe::Lexem,32>::
             New<Hpipe::Lexem::Type&,Hpipe::Source*&,char_const*&,std::__cxx11::string>
                       ((Pool<Hpipe::Lexem,32> *)&this->lexem_pool,&local_34,(Source **)&beg_local,
                        &end_local,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&p + 7));
    local_a0 = pLVar4;
    if (this->last == (Lexem *)0x0) {
      ppLVar3 = std::vector<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>::back
                          (&this->stack_last);
      pLVar1 = local_a0;
      pLVar4 = *ppLVar3;
      local_d0 = pLVar4;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_f0,"[",&local_f1);
      bVar2 = Lexem::eq(pLVar4,&local_f0);
      pLVar4->children[bVar2] = pLVar1;
      std::__cxx11::string::~string((string *)&local_f0);
      std::allocator<char>::~allocator((allocator<char> *)&local_f1);
      local_a0->parent = local_d0;
    }
    else {
      this->last->next = pLVar4;
    }
    local_a0->prev = this->last;
    this->last = local_a0;
    if (local_38 < 0) {
      local_a0->sibling = (Lexem *)0x0;
    }
    else {
      local_a0->sibling = this->sibling[local_38];
      this->sibling[local_38] = local_a0;
    }
    if ((delim == '(') || (delim == '[')) {
      std::vector<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>::push_back
                (&this->stack_last,&local_a0);
      this->last = (Lexem *)0x0;
    }
    return (int)_grp_local - (int)end_local;
  }
  bVar2 = std::vector<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>::empty(&this->stack_last);
  if (bVar2) {
    ErrorList::add(this->error_list,this->last->source,end_local,
                   "Closing parenthesis without opening correspondance.");
    return (int)_grp_local - (int)end_local;
  }
  ppLVar3 = std::vector<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>::back(&this->stack_last);
  this->last = *ppLVar3;
  std::vector<Hpipe::Lexem_*,_std::allocator<Hpipe::Lexem_*>_>::pop_back(&this->stack_last);
  local_5a = 0;
  local_6d = 0;
  item._6_1_ = 0;
  item._5_1_ = 0;
  if (delim == ')') {
    pLVar4 = this->last;
    std::allocator<char>::allocator();
    local_5a = 1;
    std::__cxx11::string::string((string *)&local_58,"(",&local_59);
    local_6d = 1;
    bVar2 = Lexem::eq(pLVar4,&local_58);
    local_112 = 1;
    if (!bVar2) goto LAB_00241e09;
  }
  local_113 = 0;
  if (delim == ']') {
    pLVar4 = this->last;
    std::allocator<char>::allocator();
    item._6_1_ = 1;
    std::__cxx11::string::string((string *)&local_90,"[",(allocator *)((long)&item + 7));
    item._5_1_ = 1;
    bVar2 = Lexem::eq(pLVar4,&local_90);
    local_113 = bVar2 ^ 0xff;
  }
  local_112 = local_113;
LAB_00241e09:
  if ((item._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_90);
  }
  if ((item._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&item + 7));
  }
  if ((local_6d & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_58);
  }
  if ((local_5a & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  if ((local_112 & 1) != 0) {
    err(this,this->last,"Non matching parenthesis.");
  }
  return (int)_grp_local - (int)end_local;
}

Assistant:

int Lexer::push_tok( Source *source, const char *beg, const char *end, Lexem::Type type, int grp, char delim ) {
    if ( delim == ')' or delim == ']' ) {
        if ( stack_last.empty() ) {
            error_list.add( last->source, beg, "Closing parenthesis without opening correspondance." );
            return end - beg;
        }
        last = stack_last.back();
        stack_last.pop_back();
        if ( ( delim == ')' and not last->eq( "(" ) ) or ( delim == ']' and not last->eq( "[" ) ) )
            err( last, "Non matching parenthesis." );
        return end - beg;
    }

    Lexem *item = lexem_pool.New( type, source, beg, std::string{ beg, end } );
    if ( last ) {
        last->next = item;
    } else {
        Lexem *p = stack_last.back();
        p->children[ p->eq( "[" ) ] = item;
        item->parent = p;
    }
    item->prev = last;
    last = item;

    if ( grp >= 0 ) {
        item->sibling = sibling[ grp ];
        sibling[ grp ] = item;
    } else
        item->sibling = 0;

    // PRINT( String( beg, end ), grp, type );
    if ( delim == '(' or delim == '[' ) {
        stack_last.push_back( item );
        last = 0;
    }

    return end - beg;
}